

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O1

Result wabt::ParseFloat(LiteralType literal_type,char *s,char *end,uint32_t *out_bits)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  Result RVar6;
  uint32_t uVar7;
  char *pcVar8;
  byte bVar9;
  char cVar10;
  int iVar11;
  uint unaff_EBX;
  uint uVar12;
  char *pcVar13;
  byte *pbVar14;
  byte *pbVar15;
  char *pcVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  
  switch(literal_type) {
  case Int:
  case Float:
    RVar6 = anon_unknown_0::FloatParser<float>::ParseFloat(s,end,out_bits);
    return (Result)RVar6.enum_;
  case Hexfloat:
    cVar1 = *s;
    pcVar13 = s + ((cVar1 - 0x2bU & 0xfd) == 0);
    if (pcVar13 < end) {
      lVar17 = 0;
      do {
        pcVar8 = "";
        if (lVar17 == 2) break;
        if (pcVar13[lVar17] != ":0x"[lVar17 + 1]) goto LAB_001639a2;
        lVar5 = lVar17 + 1;
        lVar17 = lVar17 + 1;
        pcVar8 = end + (long)(":0x" + (1 - (long)pcVar13));
      } while (pcVar13 + lVar5 != end);
    }
    else {
      pcVar8 = "0x";
    }
    if (*pcVar8 != '\0') {
LAB_001639a2:
      __assert_fail("StringStartsWith(s, end, \"0x\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/literal.cc"
                    ,0x107,
                    "static Result wabt::(anonymous namespace)::FloatParser<float>::ParseHex(const char *, const char *, Uint *) [T = float]"
                   );
    }
    pbVar14 = (byte *)(pcVar13 + 2);
    bVar3 = false;
    bVar23 = pbVar14 < end;
    if (bVar23) {
      bVar24 = false;
      bVar23 = true;
      iVar18 = 0;
      uVar19 = 0;
      bVar4 = false;
      bVar3 = false;
      do {
        bVar9 = *pbVar14;
        if (bVar9 == 0x2e) {
          bVar24 = true;
LAB_001635ee:
          bVar2 = false;
          uVar12 = unaff_EBX;
        }
        else {
          if (bVar9 == 0x5f) goto LAB_001635ee;
          iVar21 = (int)(char)bVar9;
          bVar2 = true;
          bVar22 = true;
          uVar12 = iVar21 - 0x30U;
          if (9 < iVar21 - 0x30U) {
            if (iVar21 - 0x61U < 6) {
              uVar12 = iVar21 - 0x57;
            }
            else {
              bVar22 = iVar21 - 0x41U < 6;
              uVar12 = unaff_EBX;
              if (bVar22) {
                uVar12 = iVar21 - 0x37;
              }
            }
          }
          if (bVar22) {
            if (uVar19 < 0x1000000) {
              uVar19 = uVar19 * 0x10 + uVar12;
              iVar21 = iVar18 + -4;
              if (!bVar24) {
                iVar21 = iVar18;
              }
            }
            else {
              bVar3 = true;
              if (uVar12 == 0) {
                bVar3 = bVar4;
              }
              if (bVar4) {
                bVar3 = bVar4;
              }
              iVar21 = iVar18 + 4;
              bVar4 = bVar3;
              if (bVar24) {
                iVar21 = iVar18;
              }
            }
            bVar2 = false;
            iVar18 = iVar21;
          }
        }
        pbVar15 = pbVar14;
        if (bVar2) break;
        pbVar14 = pbVar14 + 1;
        bVar23 = pbVar14 < end;
        pbVar15 = (byte *)end;
        unaff_EBX = uVar12;
      } while (bVar23);
    }
    else {
      uVar19 = 0;
      iVar18 = 0;
      pbVar15 = pbVar14;
    }
    if (uVar19 != 0) {
      iVar21 = 0;
      bVar24 = false;
      if (bVar23) {
        if ((*pbVar15 | 0x20) != 0x70) {
          __assert_fail("*s == \'p\' || *s == \'P\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/literal.cc"
                        ,0x137,
                        "static Result wabt::(anonymous namespace)::FloatParser<float>::ParseHex(const char *, const char *, Uint *) [T = float]"
                       );
        }
        iVar21 = 0;
        pbVar14 = pbVar15 + 1;
        iVar20 = 0;
        if (pbVar15[1] == 0x2b) {
          pbVar14 = pbVar15 + 2;
          iVar20 = iVar18;
        }
        bVar24 = pbVar15[1] == 0x2d;
        if (bVar24) {
          pbVar14 = pbVar15 + 2;
          iVar20 = -iVar18;
        }
        if (pbVar14 < end) {
          iVar21 = 0;
          do {
            if ((char)*pbVar14 != 0x5f) {
              uVar12 = (int)(char)*pbVar14 - 0x30;
              if (9 < uVar12) {
                __assert_fail("digit <= 9",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/literal.cc"
                              ,0x14c,
                              "static Result wabt::(anonymous namespace)::FloatParser<float>::ParseHex(const char *, const char *, Uint *) [T = float]"
                             );
              }
              iVar21 = uVar12 + iVar21 * 10;
              if (0x7f < iVar21 + iVar20) break;
            }
            pbVar14 = pbVar14 + 1;
          } while (pbVar14 != (byte *)end);
        }
      }
      iVar20 = -iVar21;
      if (!bVar24) {
        iVar20 = iVar21;
      }
      uVar12 = 0x1f;
      if (uVar19 != 0) {
        for (; uVar19 >> uVar12 == 0; uVar12 = uVar12 - 1) {
        }
      }
      uVar12 = uVar12 ^ 0x1f;
      iVar21 = iVar20 + (iVar18 - uVar12) + 0x1f;
      iVar20 = iVar20 + (iVar18 - uVar12);
      cVar10 = (char)uVar12;
      if (-0x7f < iVar21) {
        if (uVar19 < 0x1000000) {
          if (uVar12 != 8) {
            uVar19 = uVar19 << (cVar10 - 8U & 0x1f);
          }
        }
        else {
          iVar11 = 1 << (7U - cVar10 & 0x1f);
          iVar18 = 0;
          if (bVar3) {
            iVar18 = iVar11;
          }
          if ((uVar19 >> ((byte)(8U - cVar10) & 0x1f) & 1) != 0) {
            iVar18 = iVar11;
          }
          uVar19 = iVar18 + uVar19 >> (8U - cVar10 & 0x1f);
          if (0xffffff < uVar19) {
            iVar21 = iVar20 + 0x20;
          }
        }
        if (iVar21 < 0x80) {
          *out_bits = iVar21 * 0x800000 + 0x3f800000U |
                      (uint)(cVar1 == '-') << 0x1f | uVar19 & 0x7fffff;
          return (Result)Ok;
        }
        return (Result)Error;
      }
      if (uVar19 < 0x800000) {
        if (uVar12 != 9) {
          uVar19 = uVar19 << (cVar10 - 9U & 0x1f);
        }
      }
      else {
        bVar3 = (bool)(bVar3 | (uVar19 & ~(-1 << (8U - cVar10 & 0x1f))) != 0);
        uVar19 = uVar19 >> (9U - cVar10 & 0x1f);
      }
      if (-0x97 < iVar21) {
        if (iVar21 != -0x7f) {
          bVar9 = 0x61 - (char)iVar20;
          iVar21 = 1 << (bVar9 & 0x1f);
          iVar18 = 0;
          if (bVar3) {
            iVar18 = iVar21;
          }
          if ((uVar19 & (~(-1 << (bVar9 & 0x1f)) | 1 << (-iVar20 - 0x9eU & 0x1f))) != 0) {
            iVar18 = iVar21;
          }
          uVar19 = iVar18 + uVar19 >> ((byte)(-iVar20 - 0x9eU) & 0x1f) & 0x7fffff;
        }
        if (uVar19 != 0) {
          if (uVar19 < 0x800000) {
            *out_bits = uVar19 | (uint)(cVar1 == '-') << 0x1f;
            return (Result)Ok;
          }
          goto LAB_00163a23;
        }
      }
    }
    uVar7 = (uint)(cVar1 == '-') << 0x1f;
    break;
  case Infinity:
    pcVar13 = s + ((*s - 0x2bU & 0xfd) == 0);
    if (pcVar13 < end) {
      lVar17 = 0;
      do {
        pcVar8 = "";
        if (lVar17 == 3) break;
        if (pcVar13[lVar17] != "inf"[lVar17]) goto LAB_001639c1;
        lVar5 = lVar17 + 1;
        lVar17 = lVar17 + 1;
        pcVar8 = "inf" + ((long)end - (long)pcVar13);
      } while (pcVar13 + lVar5 != end);
    }
    else {
      pcVar8 = "inf";
    }
    if (*pcVar8 == '\0') {
      *out_bits = (uint)(*s != '-') * -0x80000000 - 0x800000;
      return (Result)Ok;
    }
LAB_001639c1:
    __assert_fail("StringStartsWith(s, end, \"inf\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/literal.cc"
                  ,0x1a4,
                  "static void wabt::(anonymous namespace)::FloatParser<float>::ParseInfinity(const char *, const char *, Uint *) [T = float]"
                 );
  case Nan:
    pcVar13 = s + ((*s - 0x2bU & 0xfd) == 0);
    if (pcVar13 < end) {
      lVar17 = 0;
      do {
        pcVar8 = "";
        if (lVar17 == 3) break;
        if (pcVar13[lVar17] != "nan"[lVar17]) goto LAB_00163983;
        lVar5 = lVar17 + 1;
        lVar17 = lVar17 + 1;
        pcVar8 = "nan" + ((long)end - (long)pcVar13);
      } while (pcVar13 + lVar5 != end);
    }
    else {
      pcVar8 = "nan";
    }
    if (*pcVar8 != '\0') {
LAB_00163983:
      __assert_fail("StringStartsWith(s, end, \"nan\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/literal.cc"
                    ,0xd9,
                    "static Result wabt::(anonymous namespace)::FloatParser<float>::ParseNan(const char *, const char *, Uint *) [T = float]"
                   );
    }
    pcVar8 = pcVar13 + 3;
    if (pcVar8 == end) {
      uVar19 = 0x400000;
    }
    else {
      if (pcVar8 < end) {
        lVar17 = 0;
        do {
          pcVar16 = "";
          if (lVar17 == 3) break;
          if (pcVar8[lVar17] != ":0x"[lVar17]) goto LAB_001639e0;
          lVar5 = lVar17 + 1;
          lVar17 = lVar17 + 1;
          pcVar16 = ":0x" + ((long)end - (long)pcVar8);
        } while (pcVar8 + lVar5 != end);
      }
      else {
        pcVar16 = ":0x";
      }
      if (*pcVar16 != '\0') {
LAB_001639e0:
        __assert_fail("StringStartsWith(s, end, \":0x\")",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/literal.cc"
                      ,0xdf,
                      "static Result wabt::(anonymous namespace)::FloatParser<float>::ParseNan(const char *, const char *, Uint *) [T = float]"
                     );
      }
      pcVar13 = pcVar13 + 6;
      uVar19 = 0;
      if (pcVar13 < end) {
        uVar19 = 0;
        do {
          iVar18 = (int)*pcVar13;
          if (iVar18 == 0x5f) {
            pcVar8 = (char *)((ulong)pcVar8 & 0xffffffff);
          }
          else {
            pcVar16 = (char *)(ulong)(iVar18 - 0x30U);
            bVar23 = true;
            if (9 < iVar18 - 0x30U) {
              if (iVar18 - 0x61U < 6) {
                pcVar16 = (char *)(ulong)(iVar18 - 0x57);
              }
              else {
                bVar23 = iVar18 - 0x41U < 6;
                uVar12 = (uint)pcVar8;
                if (bVar23) {
                  uVar12 = iVar18 - 0x37;
                }
                pcVar16 = (char *)(ulong)uVar12;
              }
            }
            uVar19 = uVar19 * 0x10 + (int)pcVar16;
            if (!bVar23) {
              return (Result)Error;
            }
            pcVar8 = pcVar16;
            if (0x7fffff < uVar19) {
              return (Result)Error;
            }
          }
          pcVar13 = pcVar13 + 1;
        } while (pcVar13 < end);
      }
      if (uVar19 == 0) {
        return (Result)Error;
      }
    }
    if (0x7fffff < uVar19) {
LAB_00163a23:
      __assert_fail("sig <= Traits::kSigMask",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/literal.cc"
                    ,0xb9,
                    "static typename FloatParser<T>::Uint wabt::(anonymous namespace)::FloatParser<float>::Make(bool, int, Uint) [T = float]"
                   );
    }
    uVar7 = ((uint)(*s != '-') * -0x80000000 + uVar19) - 0x800000;
    break;
  default:
    abort();
  }
  *out_bits = uVar7;
  return (Result)Ok;
}

Assistant:

Result FloatParser<T>::Parse(LiteralType literal_type,
                             const char* s,
                             const char* end,
                             Uint* out_bits) {
#if COMPILER_IS_MSVC
  if (literal_type == LiteralType::Int && StringStartsWith(s, end, "0x")) {
    // Some MSVC crt implementation of strtof doesn't support hex strings
    literal_type = LiteralType::Hexfloat;
  }
#endif
  switch (literal_type) {
    case LiteralType::Int:
    case LiteralType::Float:
      return ParseFloat(s, end, out_bits);

    case LiteralType::Hexfloat:
      return ParseHex(s, end, out_bits);

    case LiteralType::Infinity:
      ParseInfinity(s, end, out_bits);
      return Result::Ok;

    case LiteralType::Nan:
      return ParseNan(s, end, out_bits);
  }

  WABT_UNREACHABLE;
}